

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void glslang::ModifyFlatDecoration(char *name,bool flat,TSymbolTable *symbolTable)

{
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  long lVar3;
  TQualifier *symQualifier;
  TString local_50;
  TSymbol *local_28;
  TSymbol *symbol;
  TSymbolTable *symbolTable_local;
  char *pcStack_10;
  bool flat_local;
  char *name_local;
  
  symbol = (TSymbol *)symbolTable;
  symbolTable_local._7_1_ = flat;
  pcStack_10 = name;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&symQualifier);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             name,(pool_allocator<char> *)&symQualifier);
  pTVar2 = TSymbolTable::find(symbolTable,&local_50,(bool *)0x0,(bool *)0x0,(int *)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_50);
  if (pTVar2 != (TSymbol *)0x0) {
    local_28 = pTVar2;
    iVar1 = (*pTVar2->_vptr_TSymbol[0xd])();
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))();
    *(ulong *)(lVar3 + 8) =
         *(ulong *)(lVar3 + 8) & 0xffffffff7fffffff | (ulong)(symbolTable_local._7_1_ & 1) << 0x1f;
  }
  return;
}

Assistant:

static void ModifyFlatDecoration(const char* name, bool flat, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(name);
    if (symbol == nullptr)
        return;

    TQualifier& symQualifier = symbol->getWritableType().getQualifier();
    symQualifier.flat = flat;
}